

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAtCall(FunctionResolver *this,CallOrCast *call)

{
  CommaSeparatedList *pCVar1;
  size_t sVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  Expression *o;
  Expression *source;
  long lVar4;
  bool bVar5;
  int iVar6;
  ArraySize AVar7;
  PoolItem *pPVar8;
  Expression *e;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  Type local_168;
  pool_ptr<soul::AST::Expression> local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if ((pCVar1 == (CommaSeparatedList *)0x0) || ((pCVar1->items).numActive != 2)) {
    CompileMessageHelpers::createMessage<>
              (&local_68,syntax,error,"The \'at\' method expects one argument");
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_68,false);
  }
  if (pCVar1 == (CommaSeparatedList *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  sVar2 = (pCVar1->items).numActive;
  if ((sVar2 == 0) || (sVar2 == 1)) {
    throwInternalCompilerError("index < numActive","operator[]",0x9e);
  }
  ppVar3 = (pCVar1->items).items;
  o = ppVar3->object;
  source = ppVar3[1].object;
  local_168._0_8_ = (Expression *)0x800000001;
  local_168.boundingSize = 0;
  local_168.arrayElementBoundingSize = 0;
  local_168.structure.object = (Structure *)0x0;
  iVar6 = (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(source);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
  if ((char)iVar6 == '\0') {
    local_168._0_8_ = (Expression *)0x700000001;
    local_168.boundingSize = 0;
    local_168.arrayElementBoundingSize = 0;
    local_168.structure.object = (Structure *)0x0;
    SanityCheckPass::expectSilentCastPossible
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_168,source);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
  }
  if (o->kind != value) {
    if (o->kind != endpoint) {
      CompileMessageHelpers::createMessage<>(&local_d8,syntax,error,"Expected a value or endpoint");
      AST::Context::throwError
                (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                  context,&local_d8,false);
    }
    iVar6 = (*(o->super_Statement).super_ASTObject._vptr_ASTObject[3])(o);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(o->super_Statement).super_ASTObject._vptr_ASTObject[9])(o);
      if ((char)iVar6 != '\0') {
        (*(o->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_168,o);
        if ((Expression *)local_168._0_8_ == (Expression *)0x0) {
          e = (Expression *)0x0;
        }
        else {
          lVar4 = *(long *)&(((Expression *)(local_168._0_8_ + 0x30))->super_Statement).
                            super_ASTObject.objectType;
          if (lVar4 == 0) {
            CompileMessageHelpers::createMessage<>
                      (&local_110,syntax,error,"Cannot resolve the source of the \'at\' method");
            AST::Context::throwError(&(o->super_Statement).super_ASTObject.context,&local_110,false)
            ;
          }
          e = *(Expression **)(lVar4 + 0x30);
        }
        if (e != (Expression *)0x0) {
          bVar5 = AST::isResolvedAsConstant(e);
          if (!bVar5) {
            throwInternalCompilerError
                      ("AST::isResolvedAsConstant (endpointArraySize)","createAtCall",0xa48);
          }
          (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_168,e);
          if ((Expression *)local_168._0_8_ == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          AVar7 = TypeRules::checkAndGetArraySize<soul::AST::Context&>
                            (&(e->super_Statement).super_ASTObject.context,
                             (Value *)(local_168._0_8_ + 0x30));
          if ((int)AVar7 != 0) goto LAB_0021c064;
        }
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,
                   "The \'at\' method can only be applied to a vector or array");
        AST::Context::throwError
                  (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                    context,&local_a0,false);
      }
    }
    throwInternalCompilerError("AST::isResolvedAsOutput (array)","createAtCall",0xa39);
  }
  (*(o->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_168,o);
  if ((local_168.category & ~primitive) != vector) {
    CompileMessageHelpers::createMessage<>
              (&local_148,syntax,error,"The \'at\' method can only be applied to a vector or array")
    ;
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_148,false);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
LAB_0021c064:
  pPVar8 = PoolAllocator::allocateSpaceForObject
                     (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,0x50);
  local_150.object = (Expression *)0x0;
  local_168._0_8_ = source;
  AST::ArrayElementRef::ArrayElementRef
            ((ArrayElementRef *)&pPVar8->item,
             &(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
             o,(pool_ptr<soul::AST::Expression> *)&local_168,&local_150,false);
  pPVar8->destructor =
       PoolAllocator::
       allocate<soul::AST::ArrayElementRef,_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::Expression_&,_std::nullptr_t,_bool>
       ::anon_class_1_0_00000001::__invoke;
  pPVar8[2].field_0x19 = 1;
  return (Expression *)&pPVar8->item;
}

Assistant:

AST::Expression& createAtCall (AST::CallOrCast& call)
        {
            if (call.getNumArguments() != 2)
                call.context.throwError (Errors::atMethodTakes1Arg());

            auto& array = call.arguments->items[0].get();
            auto& index = call.arguments->items[1].get();

            if (! index.canSilentlyCastTo (PrimitiveType::int64))
                SanityCheckPass::expectSilentCastPossible (call.context, Type (PrimitiveType::int32), index);

            if (array.kind == AST::ExpressionKind::endpoint)
            {
                SOUL_ASSERT (AST::isResolvedAsOutput (array));
                pool_ptr<AST::Expression> endpointArraySize;

                if (auto endpoint = array.getAsEndpoint())
                {
                    if (endpoint->isUnresolvedChildReference())
                        array.context.throwError (Errors::cannotResolveSourceOfAtMethod());

                    endpointArraySize = endpoint->getDetails().arraySize;
                }

                Type::BoundedIntSize arraySize = 0;

                if (endpointArraySize != nullptr)
                {
                    SOUL_ASSERT (AST::isResolvedAsConstant (endpointArraySize));
                    arraySize = static_cast<Type::BoundedIntSize> (TypeRules::checkAndGetArraySize (endpointArraySize->context,
                                                                                                    endpointArraySize->getAsConstant()->value));
                }

                if (arraySize == 0)
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else if (array.kind == AST::ExpressionKind::value)
            {
                auto arrayType = array.getResultType();

                if (! arrayType.isArrayOrVector())
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else
            {
                call.context.throwError (Errors::expectedValueOrEndpoint());
            }

            auto& ref = allocator.allocate<AST::ArrayElementRef> (call.context, array, index, nullptr, false);
            ref.suppressWrapWarning = true;
            return ref;
        }